

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Clara::Parser::parseIntoTokens
          (Parser *this,int argc,char **argv,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens)

{
  long lVar1;
  allocator local_51;
  string local_50;
  
  for (lVar1 = 1; lVar1 < argc; lVar1 = lVar1 + 1) {
    std::__cxx11::string::string((string *)&local_50,argv[lVar1],&local_51);
    parseIntoTokens(this,&local_50,tokens);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void parseIntoTokens( int argc, char const * const * argv, std::vector<Parser::Token>& tokens ) const {
            for( int i = 1; i < argc; ++i )
                parseIntoTokens( argv[i] , tokens);
        }